

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O2

stumpless_entry *
stumpless_set_entry_priority
          (stumpless_entry *entry,stumpless_facility facility,stumpless_severity severity)

{
  int iVar1;
  wchar_t wVar2;
  
  if (entry == (stumpless_entry *)0x0) {
    raise_argument_empty("entry was NULL");
  }
  else {
    iVar1 = facility_is_invalid(facility);
    if (iVar1 == 0) {
      iVar1 = severity_is_invalid(severity);
      if (iVar1 == 0) {
        lock_entry(entry);
        wVar2 = get_prival(facility,severity);
        entry->prival = wVar2;
        unlock_entry(entry);
        clear_error();
        return entry;
      }
      raise_invalid_severity(severity);
    }
    else {
      raise_invalid_facility(facility);
    }
  }
  return (stumpless_entry *)0x0;
}

Assistant:

struct stumpless_entry *
stumpless_set_entry_priority( struct stumpless_entry *entry,
                              enum stumpless_facility facility,
                              enum stumpless_severity severity ) {
  VALIDATE_ARG_NOT_NULL( entry );

  if( facility_is_invalid( facility ) ) {
    raise_invalid_facility( facility );
    return NULL;
  }

  if( severity_is_invalid( severity ) ) {
    raise_invalid_severity( severity );
    return NULL;
  }

  lock_entry( entry );
  entry->prival = get_prival( facility, severity );
  unlock_entry( entry );

  clear_error(  );
  return entry;
}